

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

bool __thiscall CBlockPolicyEstimator::Read(CBlockPolicyEstimator *this,AutoFile *filein)

{
  long lVar1;
  string_view logging_function;
  ConstevalFormatString<2U> fmt;
  TxConfirmStats *this_00;
  runtime_error *prVar2;
  AutoFile *pAVar3;
  Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_std::vector<double,_std::allocator<double>_>_&>
  WVar4;
  ulong uVar5;
  size_type sVar6;
  mapped_type_conflict2 *pmVar7;
  long in_RDI;
  long in_FS_OFFSET;
  exception *e;
  uint i;
  size_t numBuckets;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileLongStats;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileShortStats;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileFeeStats;
  vector<double,_std::allocator<double>_> fileBuckets;
  uint nFileHistoricalBest;
  uint nFileHistoricalFirst;
  uint nFileBestSeenHeight;
  int nVersionThatWrote;
  int nVersionRequired;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe30;
  AutoFile *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffe60;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffe68;
  LogFlags in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  int source_line;
  uint _scale;
  double in_stack_fffffffffffffea8;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  string_view in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  uint uVar8;
  mapped_type_conflict2 mVar9;
  char *in_stack_fffffffffffffef8;
  TxConfirmStats *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff58;
  uint local_70;
  uint local_6c;
  uint local_44;
  int local_3c;
  Level in_stack_ffffffffffffffd0;
  string local_28 [8];
  char (*in_stack_ffffffffffffffe0) [5];
  int *in_stack_ffffffffffffffe8;
  
  source_line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fmt.fmt = (char *)MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe2c,
                                                        in_stack_fffffffffffffe28));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe4c,SUB41((uint)in_stack_fffffffffffffe48 >> 0x18,0));
  this_00 = (TxConfirmStats *)
            AutoFile::operator>>(in_stack_fffffffffffffe38,(int *)in_stack_fffffffffffffe30);
  AutoFile::operator>>(in_stack_fffffffffffffe38,(int *)in_stack_fffffffffffffe30);
  if (0x46c6c < local_3c) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<int>
              (in_stack_fffffffffffffe58,
               (int *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    std::runtime_error::runtime_error(prVar2,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_004f275a;
  }
  AutoFile::operator>>(in_stack_fffffffffffffe38,(uint *)in_stack_fffffffffffffe30);
  if (local_3c < 0x2498c) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               in_stack_fffffffffffffe40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe28 = 2;
    logging_function._M_len._4_4_ = in_stack_fffffffffffffef4;
    logging_function._M_len._0_4_ = in_stack_fffffffffffffef0;
    logging_function._M_str = in_stack_fffffffffffffef8;
    LogPrintFormatInternal<char[5],int>
              (logging_function,in_stack_fffffffffffffee0,source_line,in_stack_fffffffffffffe90,
               in_stack_ffffffffffffffd0,fmt,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  }
  else {
    pAVar3 = AutoFile::operator>>(in_stack_fffffffffffffe38,(uint *)in_stack_fffffffffffffe30);
    uVar8 = (uint)((ulong)pAVar3 >> 0x20);
    AutoFile::operator>>(in_stack_fffffffffffffe38,(uint *)in_stack_fffffffffffffe30);
    if ((local_70 < local_6c) || (local_44 < local_70)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Corrupt estimates file. Historical block range for estimates is invalid");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004f275a;
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    WVar4 = Using<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,std::vector<double,std::allocator<double>>&>
                      (in_stack_fffffffffffffe30);
    _scale = (uint)((ulong)WVar4.m_object >> 0x20);
    AutoFile::operator>>
              (in_stack_fffffffffffffe38,
               (Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_std::vector<double,_std::allocator<double>_>_&>
                *)in_stack_fffffffffffffe30);
    pAVar3 = (AutoFile *)
             std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    if ((pAVar3 < (AutoFile *)0x2) || ((AutoFile *)0x3e8 < pAVar3)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004f275a;
    }
    operator_new(0xb0);
    TxConfirmStats::TxConfirmStats
              (this_00,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,uVar8,
               in_stack_fffffffffffffea8,_scale);
    std::unique_ptr<TxConfirmStats,std::default_delete<TxConfirmStats>>::
    unique_ptr<std::default_delete<TxConfirmStats>,void>
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),(pointer)0x4f21f9);
    operator_new(0xb0);
    TxConfirmStats::TxConfirmStats
              (this_00,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,uVar8,
               in_stack_fffffffffffffea8,_scale);
    std::unique_ptr<TxConfirmStats,std::default_delete<TxConfirmStats>>::
    unique_ptr<std::default_delete<TxConfirmStats>,void>
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),(pointer)0x4f2254);
    operator_new(0xb0);
    TxConfirmStats::TxConfirmStats
              (this_00,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,uVar8,
               in_stack_fffffffffffffea8,_scale);
    std::unique_ptr<TxConfirmStats,std::default_delete<TxConfirmStats>>::
    unique_ptr<std::default_delete<TxConfirmStats>,void>
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),(pointer)0x4f22af);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    TxConfirmStats::Read
              (in_stack_ffffffffffffff00,pAVar3,in_stack_fffffffffffffef4,in_stack_ffffffffffffff58)
    ;
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    TxConfirmStats::Read
              (in_stack_ffffffffffffff00,pAVar3,in_stack_fffffffffffffef4,in_stack_ffffffffffffff58)
    ;
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    TxConfirmStats::Read
              (in_stack_ffffffffffffff00,pAVar3,in_stack_fffffffffffffef4,in_stack_ffffffffffffff58)
    ;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)this_00,in_stack_fffffffffffffec0);
    std::
    map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
    ::clear((map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
             *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    uVar8 = 0;
    while( true ) {
      uVar5 = (ulong)uVar8;
      sVar6 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (sVar6 <= uVar5) break;
      mVar9 = uVar8;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe38,
                 (size_type)in_stack_fffffffffffffe30);
      pmVar7 = std::
               map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
               ::operator[]((map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                             *)CONCAT44(uVar8,in_stack_fffffffffffffe50),
                            (key_type_conflict3 *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      *pmVar7 = uVar8;
      uVar8 = mVar9 + 1;
    }
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator=
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_fffffffffffffe38,
               (unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_fffffffffffffe30);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator=
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_fffffffffffffe38,
               (unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_fffffffffffffe30);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator=
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_fffffffffffffe38,
               (unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_fffffffffffffe30);
    *(uint *)(in_RDI + 0x58) = local_44;
    *(uint *)(in_RDI + 0x60) = local_6c;
    *(uint *)(in_RDI + 100) = local_70;
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_fffffffffffffe38);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_fffffffffffffe38);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_fffffffffffffe38);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe38);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
LAB_004f275a:
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::Read(AutoFile& filein)
{
    try {
        LOCK(m_cs_fee_estimator);
        int nVersionRequired, nVersionThatWrote;
        filein >> nVersionRequired >> nVersionThatWrote;
        if (nVersionRequired > CLIENT_VERSION) {
            throw std::runtime_error(strprintf("up-version (%d) fee estimate file", nVersionRequired));
        }

        // Read fee estimates file into temporary variables so existing data
        // structures aren't corrupted if there is an exception.
        unsigned int nFileBestSeenHeight;
        filein >> nFileBestSeenHeight;

        if (nVersionRequired < 149900) {
            LogPrintf("%s: incompatible old fee estimation data (non-fatal). Version: %d\n", __func__, nVersionRequired);
        } else { // New format introduced in 149900
            unsigned int nFileHistoricalFirst, nFileHistoricalBest;
            filein >> nFileHistoricalFirst >> nFileHistoricalBest;
            if (nFileHistoricalFirst > nFileHistoricalBest || nFileHistoricalBest > nFileBestSeenHeight) {
                throw std::runtime_error("Corrupt estimates file. Historical block range for estimates is invalid");
            }
            std::vector<double> fileBuckets;
            filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(fileBuckets);
            size_t numBuckets = fileBuckets.size();
            if (numBuckets <= 1 || numBuckets > 1000) {
                throw std::runtime_error("Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
            }

            std::unique_ptr<TxConfirmStats> fileFeeStats(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
            std::unique_ptr<TxConfirmStats> fileShortStats(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
            std::unique_ptr<TxConfirmStats> fileLongStats(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));
            fileFeeStats->Read(filein, nVersionThatWrote, numBuckets);
            fileShortStats->Read(filein, nVersionThatWrote, numBuckets);
            fileLongStats->Read(filein, nVersionThatWrote, numBuckets);

            // Fee estimates file parsed correctly
            // Copy buckets from file and refresh our bucketmap
            buckets = fileBuckets;
            bucketMap.clear();
            for (unsigned int i = 0; i < buckets.size(); i++) {
                bucketMap[buckets[i]] = i;
            }

            // Destroy old TxConfirmStats and point to new ones that already reference buckets and bucketMap
            feeStats = std::move(fileFeeStats);
            shortStats = std::move(fileShortStats);
            longStats = std::move(fileLongStats);

            nBestSeenHeight = nFileBestSeenHeight;
            historicalFirst = nFileHistoricalFirst;
            historicalBest = nFileHistoricalBest;
        }
    }
    catch (const std::exception& e) {
        LogPrintf("CBlockPolicyEstimator::Read(): unable to read policy estimator data (non-fatal): %s\n",e.what());
        return false;
    }
    return true;
}